

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_type.cpp
# Opt level: O0

profiler_settings_t * duckdb::MetricsUtils::GetPhaseTimingMetrics(void)

{
  initializer_list<duckdb::MetricsType> __l;
  hasher *in_RDI;
  key_equal *__eql;
  hasher *__hf;
  size_type in_stack_ffffffffffffffc8;
  unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
  *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  allocator_type *__a;
  
  uVar1 = 0x10;
  uVar2 = 0x11;
  uVar3 = 0x12;
  uVar4 = 0x13;
  uVar5 = 0x14;
  uVar6 = 0x15;
  uVar7 = 0x16;
  uVar8 = 0x17;
  __a = (allocator_type *)0x8;
  __eql = (key_equal *)&stack0xffffffffffffffdd;
  __hf = in_RDI;
  ::std::allocator<duckdb::MetricsType>::allocator((allocator<duckdb::MetricsType> *)0x2adc960);
  __l._M_len._0_1_ = uVar1;
  __l._M_array = (iterator)in_stack_ffffffffffffffd8;
  __l._M_len._1_1_ = uVar2;
  __l._M_len._2_1_ = uVar3;
  __l._M_len._3_1_ = uVar4;
  __l._M_len._4_1_ = uVar5;
  __l._M_len._5_1_ = uVar6;
  __l._M_len._6_1_ = uVar7;
  __l._M_len._7_1_ = uVar8;
  ::std::
  unordered_set<duckdb::MetricsType,_duckdb::MetricsTypeHashFunction,_std::equal_to<duckdb::MetricsType>,_std::allocator<duckdb::MetricsType>_>
  ::unordered_set(in_stack_ffffffffffffffd0,__l,in_stack_ffffffffffffffc8,__hf,__eql,__a);
  ::std::allocator<duckdb::MetricsType>::~allocator((allocator<duckdb::MetricsType> *)0x2adc999);
  return (profiler_settings_t *)in_RDI;
}

Assistant:

profiler_settings_t MetricsUtils::GetPhaseTimingMetrics() {
    return {
        MetricsType::ALL_OPTIMIZERS,
        MetricsType::CUMULATIVE_OPTIMIZER_TIMING,
        MetricsType::PLANNER,
        MetricsType::PLANNER_BINDING,
        MetricsType::PHYSICAL_PLANNER,
        MetricsType::PHYSICAL_PLANNER_COLUMN_BINDING,
        MetricsType::PHYSICAL_PLANNER_RESOLVE_TYPES,
        MetricsType::PHYSICAL_PLANNER_CREATE_PLAN,
    };
}